

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O1

unsigned_long_long kj::anon_unknown_39::parseUnsigned(StringPtr *s,unsigned_long_long max)

{
  char *pcVar1;
  int *piVar2;
  ulonglong uVar3;
  int __base;
  unsigned_long_long value;
  char *endPtr;
  char *local_20;
  
  if ((s->content).size_ < 2) {
    _GLOBAL__N_1::parseUnsigned((_GLOBAL__N_1 *)s);
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar1 = (s->content).ptr;
    __base = 10;
    if (pcVar1[*pcVar1 == '-'] == '0') {
      __base = 10;
      if ((pcVar1[(ulong)(*pcVar1 == '-') + 1] & 0xdfU) == 0x58) {
        __base = 0x10;
      }
    }
    uVar3 = strtoull(pcVar1,&local_20,__base);
    pcVar1 = (s->content).ptr;
    if (local_20 == pcVar1 + ((s->content).size_ - 1)) {
      if (*piVar2 == 0x22) {
        _GLOBAL__N_1::parseUnsigned((_GLOBAL__N_1 *)s);
      }
      else if (max < uVar3) {
        _GLOBAL__N_1::parseUnsigned();
      }
      else {
        if (*pcVar1 != '-') {
          return uVar3;
        }
        _GLOBAL__N_1::parseUnsigned((_GLOBAL__N_1 *)s);
      }
    }
    else {
      _GLOBAL__N_1::parseUnsigned((_GLOBAL__N_1 *)s);
    }
  }
  return 0;
}

Assistant:

unsigned long long parseUnsigned(const StringPtr& s, unsigned long long max) {
  KJ_REQUIRE(s != nullptr, "String does not contain valid number", s) { return 0; }
  char *endPtr;
  errno = 0;
  auto value = strtoull(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  KJ_REQUIRE(endPtr == s.end(), "String does not contain valid number", s) { return 0; }
  KJ_REQUIRE(errno != ERANGE, "Value out-of-range", s) { return 0; }
  KJ_REQUIRE(value <= max, "Value out-of-range", value, max) { return 0; }
  //strtoull("-1") does not fail with ERANGE
  KJ_REQUIRE(s[0] != '-', "Value out-of-range", s) { return 0; }
  return value;
}